

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O3

ssize_t Omega_h::gmsh::read(int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  value_type *pvVar2;
  undefined4 in_register_0000003c;
  ifstream file;
  undefined8 local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  undefined1 local_220 [520];
  
  pvVar2 = filesystem::path::c_str((path *)__buf);
  std::ifstream::ifstream(local_220,pvVar2,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_230 = *(undefined8 *)__nbytes;
    local_228 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__nbytes + 8);
    if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_228->_M_use_count = local_228->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_228->_M_use_count = local_228->_M_use_count + 1;
      }
    }
    read(__fd,local_220,(size_t)&local_230);
    if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
    }
    std::ifstream::~ifstream(local_220);
    return CONCAT44(in_register_0000003c,__fd);
  }
  pvVar2 = filesystem::path::c_str((path *)__buf);
  fail("couldn\'t open \"%s\"\n",pvVar2);
}

Assistant:

Mesh read(filesystem::path const& filename, CommPtr comm) {
  std::ifstream file(filename.c_str());
  if (!file.is_open()) {
    Omega_h_fail("couldn't open \"%s\"\n", filename.c_str());
  }
  return gmsh::read(file, comm);
}